

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

void __thiscall
gutil::Properties::putValueVector<std::__cxx11::string>
          (Properties *this,char *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value,char sep)

{
  ostream *poVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  ostringstream out;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pbVar3 = (value->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (value->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 + 1 < pbVar2) {
    pbVar4 = pbVar3;
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      local_1c8._M_dataplus._M_p._0_1_ = sep;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1c8,1);
      pbVar2 = (value->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = pbVar4 + 1;
      pbVar5 = pbVar4 + 2;
      pbVar4 = pbVar3;
    } while (pbVar5 < pbVar2);
  }
  if (pbVar3 < pbVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length);
  }
  std::__cxx11::stringbuf::str();
  putString(this,key,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_1c8._M_dataplus._M_p._1_7_,(char)local_1c8._M_dataplus._M_p) !=
      &local_1c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_1c8._M_dataplus._M_p._1_7_,(char)local_1c8._M_dataplus._M_p));
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void putValueVector(const char *key,
                                           const std::vector<T> &value, const char sep='|')
    {
      std::ostringstream out;
      typename std::vector<T>::const_iterator it;

      for (it=value.begin(); it+1<value.end(); ++it)
      {
        out << *it << sep;
      }

      if (it < value.end())
      {
        out << *it;
      }

      putString(key, out.str());
    }